

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

iterator __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::emplace<int>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,const_iterator pos,int *args)

{
  int iVar1;
  size_type sVar2;
  pointer pCVar3;
  undefined8 in_RAX;
  pointer pCVar4;
  iterator extraout_RAX;
  iterator pCVar5;
  long lVar6;
  ulong uVar7;
  Constructable *src;
  Constructable temp;
  Constructable local_28;
  
  sVar2 = this->len;
  if (sVar2 == this->cap) {
    pCVar4 = emplaceRealloc<int>(this,pos,args);
    return pCVar4;
  }
  pCVar3 = this->data_;
  pCVar4 = pCVar3 + sVar2;
  if ((long)pCVar4 - (long)pos == 0) {
    iVar1 = *args;
    pCVar4->constructed = true;
    pCVar4->value = iVar1;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    pCVar5 = (iterator)(sVar2 + 1);
    this->len = (size_type)pCVar5;
  }
  else {
    local_28._1_7_ = SUB87((ulong)in_RAX >> 8,0);
    local_28.constructed = true;
    local_28.value = *args;
    pCVar4->constructed = true;
    pCVar4->value = pCVar4[-1].value;
    pCVar4[-1].value = 0;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 2;
    (anonymous_namespace)::Constructable::numMoveConstructorCalls =
         (anonymous_namespace)::Constructable::numMoveConstructorCalls + 1;
    lVar6 = ((long)pCVar4 - (long)pos) + -8 >> 3;
    if (0 < lVar6) {
      uVar7 = lVar6 + 1;
      src = pCVar3 + (sVar2 - 2);
      do {
        anon_unknown.dwarf_d691dd::Constructable::operator=(src + 1,src);
        uVar7 = uVar7 - 1;
        src = src + -1;
      } while (1 < uVar7);
    }
    anon_unknown.dwarf_d691dd::Constructable::operator=(pos,&local_28);
    this->len = this->len + 1;
    anon_unknown.dwarf_d691dd::Constructable::~Constructable(&local_28);
    pCVar5 = extraout_RAX;
  }
  return pCVar5;
}

Assistant:

iterator emplace(const_iterator pos, Args&&... args) {
        auto result = const_cast<iterator>(pos);
        if (len == cap)
            return emplaceRealloc(result, std::forward<Args>(args)...);

        if (pos == end()) {
            // Emplace at end can be constructed in place.
            new (end()) T(std::forward<Args>(args)...);
            len++;
            return result;
        }

        // Construct a temporary to avoid aliasing an existing element we're about to move.
        T temp(std::forward<Args>(args)...);

        // Manually move the last element backward by one because it's uninitialized space.
        new (end()) T(std::move(back()));

        // Now move everything else and insert our temporary.
        std::ranges::move_backward(result, end() - 1, end());
        *result = std::move(temp);

        len++;
        return result;
    }